

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadPHPCoverageDirectory(cmParsePHPCoverage *this,char *d)

{
  bool bVar1;
  Status SVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  Directory dir;
  string path;
  string file;
  Directory local_f0;
  unsigned_long local_e8;
  cmParsePHPCoverage *local_e0;
  char *local_d8;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0 = this;
  cmsys::Directory::Directory(&local_f0);
  local_d8 = d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,d,(allocator<char> *)&local_a0);
  SVar2 = cmsys::Directory::Load(&local_f0,(string *)&local_d0,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (SVar2.Kind_ == Success) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_f0);
    local_e8 = uVar3;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      pcVar4 = cmsys::Directory::GetFile(&local_f0,(ulong)uVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,pcVar4,(allocator<char> *)&local_d0);
      bVar1 = std::operator!=(&local_50,".");
      if (bVar1) {
        bVar1 = std::operator!=(&local_50,"..");
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
          pcVar4 = local_d8;
          if (!bVar1) {
            local_d0.View_._M_len = strlen(local_d8);
            local_d0.View_._M_str = pcVar4;
            local_a0.View_._M_len = 1;
            local_a0.View_._M_str = local_a0.Digits_;
            local_a0.Digits_[0] = '/';
            cmStrCat<std::__cxx11::string>(&local_70,&local_d0,&local_a0,&local_50);
            bVar1 = ReadPHPData(local_e0,local_70._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_70);
            uVar3 = local_e8;
            if (!bVar1) {
              std::__cxx11::string::~string((string *)&local_50);
              goto LAB_0046e444;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = true;
  }
  else {
LAB_0046e444:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_f0);
  return bVar1;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPCoverageDirectory(const char* d)
{
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (!this->ReadPHPData(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}